

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceTextModuleRecord.cpp
# Opt level: O2

HRESULT __thiscall
Js::SourceTextModuleRecord::ResolveExternalModuleDependencies(SourceTextModuleRecord *this)

{
  ModuleNamespace *pMVar1;
  void *ptr;
  code *pcVar2;
  ModuleRecordBase *scriptContext;
  bool bVar3;
  int hr;
  char16 *pcVar4;
  undefined4 *puVar5;
  Type *ppIVar6;
  JavascriptError *pError;
  SList<Ident_*,_Memory::ArenaAllocator,_RealCount> *pSVar7;
  Iterator local_60;
  void *local_50;
  ModuleRecordBase *moduleRecordBase;
  LPCOLESTR local_40;
  LPCOLESTR moduleName;
  
  pcVar4 = GetSpecifierSz(this);
  hr = 0;
  Output::TraceWithFlush(ModulePhase,L"ResolveExternalModuleDependencies(%s)\n",pcVar4);
  if ((this->requestedModuleList).ptr != (SList<Ident_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
    moduleRecordBase = (ModuleRecordBase *)(this->scriptContext).ptr;
    EnsureChildModuleSet(this,(ScriptContext *)moduleRecordBase);
    pSVar7 = (this->requestedModuleList).ptr;
    local_60.list = &pSVar7->super_SListBase<Ident_*,_Memory::ArenaAllocator,_RealCount>;
    local_60.current = (NodeBase *)pSVar7;
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    hr = 0;
    while( true ) {
      if (pSVar7 == (SList<Ident_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                    ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
        pSVar7 = (SList<Ident_*,_Memory::ArenaAllocator,_RealCount> *)local_60.current;
      }
      pSVar7 = (SList<Ident_*,_Memory::ArenaAllocator,_RealCount> *)
               (pSVar7->super_SListBase<Ident_*,_Memory::ArenaAllocator,_RealCount>).
               super_SListNodeBase<Memory::ArenaAllocator>.next;
      if (pSVar7 == (SList<Ident_*,_Memory::ArenaAllocator,_RealCount> *)local_60.list) break;
      local_60.current = (NodeBase *)pSVar7;
      ppIVar6 = SListBase<Ident_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data(&local_60);
      local_40 = (LPCOLESTR)&(*ppIVar6)->field_0x22;
      local_50 = (void *)0x0;
      moduleName = (LPCOLESTR)0x0;
      bVar3 = JsUtil::
              BaseDictionary<char16_t_const*,Js::SourceTextModuleRecord*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              ::TryGetValue<char16_t_const*>
                        ((BaseDictionary<char16_t_const*,Js::SourceTextModuleRecord*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                          *)(this->childrenModuleSet).ptr,&local_40,
                         (SourceTextModuleRecord **)&moduleName);
      pSVar7 = (SList<Ident_*,_Memory::ArenaAllocator,_RealCount> *)local_60.current;
      if (!bVar3) {
        pMVar1 = moduleRecordBase[0x79].namespaceObject.ptr;
        hr = (*(pMVar1->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
               super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x12])
                       (pMVar1,this,local_40,&local_50);
        if (hr < 0) goto LAB_009e79a4;
        moduleName = (LPCOLESTR)FromHost(local_50);
        ptr = (((SourceTextModuleRecord *)moduleName)->errorObject).ptr;
        if (ptr != (void *)0x0) {
          Memory::WriteBarrierPtr<void>::WriteBarrierSet(&this->errorObject,ptr);
          hr = -0x7fffbffb;
          goto LAB_009e79a4;
        }
        pcVar4 = GetSpecifierSz((SourceTextModuleRecord *)moduleName);
        Output::TraceWithFlush(ModulePhase,L"\t>SetParent in (%s)\n",pcVar4);
        SetParent((SourceTextModuleRecord *)moduleName,this,local_40);
        pSVar7 = (SList<Ident_*,_Memory::ArenaAllocator,_RealCount> *)local_60.current;
      }
    }
    if (hr < 0) {
LAB_009e79a4:
      scriptContext = moduleRecordBase;
      if ((this->errorObject).ptr == (void *)0x0) {
        pError = JavascriptLibrary::CreateError
                           (*(JavascriptLibrary **)&moduleRecordBase->magicNumber);
        JavascriptError::SetErrorMessageProperties
                  (pError,hr,L"fetch import module failed",(ScriptContext *)scriptContext);
        Memory::WriteBarrierPtr<void>::WriteBarrierSet(&this->errorObject,pError);
      }
      Output::TraceWithFlush(ModulePhase,L"\tfetch import module failed\n");
      NotifyParentsAsNeeded(this);
    }
  }
  return hr;
}

Assistant:

HRESULT SourceTextModuleRecord::ResolveExternalModuleDependencies()
    {
        OUTPUT_TRACE_DEBUGONLY(Js::ModulePhase, _u("ResolveExternalModuleDependencies(%s)\n"), this->GetSpecifierSz());

        ScriptContext* scriptContext = GetScriptContext();

        HRESULT hr = NOERROR;
        if (requestedModuleList != nullptr)
        {
            EnsureChildModuleSet(scriptContext);

            requestedModuleList->MapUntil([&](IdentPtr specifier) {
                LPCOLESTR moduleName = specifier->Psz();
                ModuleRecordBase* moduleRecordBase = nullptr;
                SourceTextModuleRecord* moduleRecord = nullptr;
                bool itemFound = childrenModuleSet->TryGetValue(moduleName, &moduleRecord);
                if (!itemFound)
                {
                    hr = scriptContext->GetHostScriptContext()->FetchImportedModule(this, moduleName, &moduleRecordBase);
                    if (FAILED(hr))
                    {
                        return true;
                    }
                    moduleRecord = SourceTextModuleRecord::FromHost(moduleRecordBase);
                    Var errorObject = moduleRecord->GetErrorObject();
                    if (errorObject == nullptr)
                    {
                        OUTPUT_TRACE_DEBUGONLY(Js::ModulePhase, _u("\t>SetParent in (%s)\n"), moduleRecord->GetSpecifierSz());
                        moduleRecord->SetParent(this, moduleName);
                    }
                    else
                    {
                        this->errorObject = errorObject;
                        hr = E_FAIL;
                        return true;
                    }
                }
                return false;
            });

            if (FAILED(hr))
            {
                if (this->errorObject == nullptr)
                {
                    JavascriptError *error = scriptContext->GetLibrary()->CreateError();
                    JavascriptError::SetErrorMessageProperties(error, hr, _u("fetch import module failed"), scriptContext);
                    this->errorObject = error;
                }

                OUTPUT_TRACE_DEBUGONLY(Js::ModulePhase, _u("\tfetch import module failed\n"));
                NotifyParentsAsNeeded();
            }
        }
        return hr;
    }